

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void skip_nl(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *buffer)

{
  bool bVar1;
  VARR_token_t *buffer_local;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  buffer_local = (VARR_token_t *)t;
  if (t == (token_t)0x0) {
    buffer_local = (VARR_token_t *)get_next_pptoken(c2m_ctx);
  }
  while( true ) {
    bVar1 = false;
    if ((short)(int)buffer_local->els_num != 10) {
      bVar1 = (short)(int)buffer_local->els_num != 0x147;
    }
    if (!bVar1) break;
    if (buffer != (VARR_token_t *)0x0) {
      VARR_token_tpush(buffer,(token_t)buffer_local);
    }
    buffer_local = (VARR_token_t *)get_next_pptoken(c2m_ctx);
  }
  unget_next_pptoken(c2m_ctx,(token_t)buffer_local);
  return;
}

Assistant:

static void skip_nl (c2m_ctx_t c2m_ctx, token_t t,
                     VARR (token_t) * buffer) { /* skip until new line */
  if (t == NULL) t = get_next_pptoken (c2m_ctx);
  for (; t->code != '\n' && t->code != T_EOU; t = get_next_pptoken (c2m_ctx))  // ??>
    if (buffer != NULL) VARR_PUSH (token_t, buffer, t);
  unget_next_pptoken (c2m_ctx, t);
}